

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_7::ReplaceTrinaryMinMax<(GLSLstd450)37>
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> __l;
  uint32_t set;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *insert_before;
  Analysis preserved_analyses;
  uint32_t result_type;
  FeatureManager *pFVar1;
  Instruction *pIVar2;
  uint32_t local_294;
  iterator local_290;
  undefined8 local_288;
  SmallVector<unsigned_int,_2UL> local_280;
  Operand local_258;
  uint32_t local_224;
  iterator local_220;
  undefined8 local_218;
  SmallVector<unsigned_int,_2UL> local_210;
  Operand local_1e8;
  uint local_1b4;
  iterator local_1b0;
  undefined8 local_1a8;
  SmallVector<unsigned_int,_2UL> local_1a0;
  Operand local_178;
  uint32_t local_144;
  iterator local_140;
  undefined8 local_138;
  SmallVector<unsigned_int,_2UL> local_130;
  Operand local_108;
  undefined1 local_d8 [8];
  OperandList new_operands;
  uint32_t local_b8;
  uint32_t local_b4;
  iterator local_b0;
  size_type local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  Instruction *local_88;
  Instruction *temp;
  uint32_t local_78;
  uint32_t op3;
  uint32_t op2;
  uint32_t op1;
  InstructionBuilder ir_builder;
  string local_48;
  uint32_t local_24;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvStack_20;
  uint32_t glsl405_ext_inst_id;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  pvStack_20 = param_3;
  param_2_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)ctx;
  pFVar1 = IRContext::get_feature_mgr(ctx);
  local_24 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar1);
  pIVar2 = inst_local;
  if (local_24 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GLSL.std.450",(allocator<char> *)&ir_builder.field_0x1f);
    IRContext::AddExtInstImport((IRContext *)pIVar2,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&ir_builder.field_0x1f);
    pFVar1 = IRContext::get_feature_mgr((IRContext *)inst_local);
    local_24 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar1);
  }
  pIVar2 = inst_local;
  insert_before = param_2_local;
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&op2,(IRContext *)pIVar2,(Instruction *)insert_before,
             preserved_analyses);
  op3 = opt::Instruction::GetSingleWordInOperand((Instruction *)param_2_local,2);
  local_78 = opt::Instruction::GetSingleWordInOperand((Instruction *)param_2_local,3);
  temp._4_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)param_2_local,4);
  result_type = opt::Instruction::type_id((Instruction *)param_2_local);
  set = local_24;
  local_b8 = op3;
  local_b4 = local_78;
  local_b0 = &local_b8;
  local_a8 = 2;
  std::allocator<unsigned_int>::allocator
            ((allocator<unsigned_int> *)
             ((long)&new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a0,__l,
             (allocator_type *)
             ((long)&new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pIVar2 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&op2,result_type,set,0x25,&local_a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a0);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_88 = pIVar2;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_d8);
  local_144 = local_24;
  local_140 = &local_144;
  local_138 = 1;
  init_list_02._M_len = 1;
  init_list_02._M_array = local_140;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list_02);
  Operand::Operand(&local_108,SPV_OPERAND_TYPE_ID,&local_130);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_d8,
             &local_108);
  Operand::~Operand(&local_108);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
  local_1b4 = 0x25;
  local_1b0 = &local_1b4;
  local_1a8 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_1b0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a0,init_list_01);
  Operand::Operand(&local_178,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_1a0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_d8,
             &local_178);
  Operand::~Operand(&local_178);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a0);
  local_224 = opt::Instruction::result_id(local_88);
  local_220 = &local_224;
  local_218 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_220;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_210,init_list_00);
  Operand::Operand(&local_1e8,SPV_OPERAND_TYPE_ID,&local_210);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_d8,
             &local_1e8);
  Operand::~Operand(&local_1e8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_210);
  local_294 = temp._4_4_;
  local_290 = &local_294;
  local_288 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_290;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_280,init_list);
  Operand::Operand(&local_258,SPV_OPERAND_TYPE_ID,&local_280);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_d8,
             &local_258);
  Operand::~Operand(&local_258);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_280);
  opt::Instruction::SetInOperands((Instruction *)param_2_local,(OperandList *)local_d8);
  IRContext::UpdateDefUse((IRContext *)inst_local,(Instruction *)param_2_local);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_d8);
  return true;
}

Assistant:

bool ReplaceTrinaryMinMax(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t op1 = inst->GetSingleWordInOperand(2);
  uint32_t op2 = inst->GetSingleWordInOperand(3);
  uint32_t op3 = inst->GetSingleWordInOperand(4);

  Instruction* temp = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, opcode, {op1, op2});

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl405_ext_inst_id}});
  new_operands.push_back({SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                          {static_cast<uint32_t>(opcode)}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {temp->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {op3}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}